

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tchostsi.cpp
# Opt level: O0

void __thiscall CTcHostIfcStdio::v_printf(CTcHostIfcStdio *this,char *msg,__va_list_tag *args)

{
  int iVar1;
  CCharmapToLocal *pCVar2;
  undefined4 extraout_var;
  size_t len;
  utf8_ptr p;
  char xlat_buf [1024];
  char buf [1024];
  utf8_ptr local_820;
  undefined1 local_818 [528];
  __va_list_tag *in_stack_fffffffffffff9f8;
  char *in_stack_fffffffffffffa00;
  size_t in_stack_fffffffffffffa08;
  char *in_stack_fffffffffffffa10;
  char local_418 [1048];
  
  t3vsprintf(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,
             in_stack_fffffffffffff9f8);
  pCVar2 = CTcMain::get_console_mapper();
  if (pCVar2 == (CCharmapToLocal *)0x0) {
    printf("%s",local_418);
  }
  else {
    utf8_ptr::utf8_ptr(&local_820);
    utf8_ptr::set(&local_820,local_418);
    pCVar2 = CTcMain::get_console_mapper();
    iVar1 = (*(pCVar2->super_CCharmap)._vptr_CCharmap[5])
                      (pCVar2,local_818,0x400,local_820.p_,CCharmapToLocal::source_esc_cb);
    if (CONCAT44(extraout_var,iVar1) < 0x400) {
      local_818[CONCAT44(extraout_var,iVar1)] = 0;
    }
    printf("%s",local_818);
  }
  fflush(_stdout);
  return;
}

Assistant:

void CTcHostIfcStdio::v_printf(const char *msg, va_list args)
{
    char buf[1024];
    
    /* format the message to our internal buffer */
    t3vsprintf(buf, sizeof(buf), msg, args);

    /* translate to the local character set if we have a mapper */
    if (G_tcmain->get_console_mapper() != 0)
    {
        char xlat_buf[1024];
        utf8_ptr p;
        size_t len;

        /* translate it */
        p.set(buf);
        len = G_tcmain->get_console_mapper()
              ->map_utf8z_esc(xlat_buf, sizeof(xlat_buf), p,
                              &CCharmapToLocal::source_esc_cb);

        /* if there's room, null-terminate the buffer */
        if (len < sizeof(xlat_buf))
            xlat_buf[len] = '\0';
        
        /* display it on the standard output */
        printf("%s", xlat_buf);
    }
    else
    {
        /* there's no character mapper - display the untranslated buffer */
        printf("%s", buf);
    }

    /* 
     *   Flush the standard output immediately.  If our output is being
     *   redirected to a pipe that another program is reading, this will
     *   ensure that the other program will see our output as soon as we
     *   produce it, which might be important in some cases.  In any case,
     *   we don't generally produce so much console output that this should
     *   significantly affect performance.  
     */
    fflush(stdout);
}